

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::setText
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *start,
          unsigned_long *end)

{
  unsigned_long *puVar1;
  bool bVar2;
  undefined1 local_50 [24];
  string<unsigned_long> s;
  unsigned_long *p;
  unsigned_long *end_local;
  unsigned_long *start_local;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  puVar1 = start;
  if ((long)end - (long)start >> 3 < 3) {
    while ((s._8_8_ = puVar1, (unsigned_long *)s._8_8_ != end &&
           (bVar2 = isWhiteSpace(this,*(unsigned_long *)s._8_8_), bVar2))) {
      puVar1 = (unsigned_long *)(s._8_8_ + 8);
    }
    if ((unsigned_long *)s._8_8_ == end) {
      return false;
    }
  }
  core::string<unsigned_long>::string<unsigned_long>
            ((string<unsigned_long> *)(local_50 + 0x10),start,
             (s32)((ulong)((long)end - (long)start) >> 3));
  replaceSpecialCharacters
            ((CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *)local_50,
             (string<unsigned_long> *)this);
  core::string<unsigned_long>::operator=(&this->NodeName,(string<unsigned_long> *)local_50);
  core::string<unsigned_long>::~string((string<unsigned_long> *)local_50);
  this->CurrentNodeType = EXN_TEXT;
  core::string<unsigned_long>::~string((string<unsigned_long> *)(local_50 + 0x10));
  return true;
}

Assistant:

bool setText(char_type* start, char_type* end)
	{
		// check if text is more than 2 characters, and if not, check if there is 
		// only white space, so that this text won't be reported
		if (end - start < 3)
		{
			char_type* p = start;
			for(; p != end; ++p)
				if (!isWhiteSpace(*p))
					break;

			if (p == end)
				return false;
		}

		// set current text to the parsed text, and replace xml special characters
		core::string<char_type> s(start, (int)(end - start));
		NodeName = replaceSpecialCharacters(s);

		// current XML node type is text
		CurrentNodeType = EXN_TEXT;

		return true;
	}